

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestHierarchyIterator.cpp
# Opt level: O0

void __thiscall tcu::TestHierarchyIterator::~TestHierarchyIterator(TestHierarchyIterator *this)

{
  TestNode *this_00;
  bool bVar1;
  TestNodeType TVar2;
  pointer pNVar3;
  TestNodeType nodeType;
  TestNode *node;
  reverse_iterator iter;
  TestHierarchyIterator *this_local;
  
  iter.current._M_current =
       (__normal_iterator<tcu::TestHierarchyIterator::NodeIter_*,_std::vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>_>
        )(__normal_iterator<tcu::TestHierarchyIterator::NodeIter_*,_std::vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>_>
          )this;
  std::
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  ::rbegin((vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
            *)&stack0xffffffffffffffe8);
  while( true ) {
    std::
    vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
    ::rend((vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
            *)&node);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<tcu::TestHierarchyIterator::NodeIter_*,_std::vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>_>_>
                             *)&stack0xffffffffffffffe8,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<tcu::TestHierarchyIterator::NodeIter_*,_std::vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>_>_>
                             *)&node);
    if (!bVar1) break;
    pNVar3 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<tcu::TestHierarchyIterator::NodeIter_*,_std::vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<tcu::TestHierarchyIterator::NodeIter_*,_std::vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>_>_>
                           *)&stack0xffffffffffffffe8);
    this_00 = pNVar3->node;
    TVar2 = TestNode::getNodeType(this_00);
    if (TVar2 != NODETYPE_ROOT) {
      if (TVar2 == NODETYPE_PACKAGE) {
        (*this->m_inflater->_vptr_TestHierarchyInflater[1])(this->m_inflater,this_00);
      }
      else if (TVar2 == NODETYPE_GROUP) {
        (*this->m_inflater->_vptr_TestHierarchyInflater[3])(this->m_inflater,this_00);
      }
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<tcu::TestHierarchyIterator::NodeIter_*,_std::vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<tcu::TestHierarchyIterator::NodeIter_*,_std::vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>_>_>
                  *)&stack0xffffffffffffffe8);
  }
  std::__cxx11::string::~string((string *)&this->m_nodePath);
  std::
  vector<tcu::TestHierarchyIterator::NodeIter,_std::allocator<tcu::TestHierarchyIterator::NodeIter>_>
  ::~vector(&this->m_sessionStack);
  return;
}

Assistant:

TestHierarchyIterator::~TestHierarchyIterator (void)
{
	// Tear down inflated nodes in m_sessionStack
	for (vector<NodeIter>::reverse_iterator iter = m_sessionStack.rbegin(); iter != m_sessionStack.rend(); ++iter)
	{
		TestNode* const		node		= iter->node;
		const TestNodeType	nodeType	= node->getNodeType();

		switch (nodeType)
		{
			case NODETYPE_ROOT:		/* root is not de-initialized */								break;
			case NODETYPE_PACKAGE:	m_inflater.leaveTestPackage(static_cast<TestPackage*>(node));	break;
			case NODETYPE_GROUP:	m_inflater.leaveGroupNode(static_cast<TestCaseGroup*>(node));	break;
			default:
				break;
		}
	}
}